

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

us_socket_t *
us_socket_context_connect
          (int ssl,us_socket_context_t *context,char *host,int port,char *source_host,int options,
          int socket_ext_size)

{
  int iVar1;
  us_internal_ssl_socket_t *puVar2;
  us_socket_t *s;
  addrinfo *result;
  addrinfo *local_80;
  char port_string [16];
  addrinfo local_68;
  
  if (ssl != 0) {
    puVar2 = us_internal_ssl_socket_context_connect
                       ((us_internal_ssl_socket_context_t *)context,host,port,source_host,options,
                        socket_ext_size);
    return &puVar2->s;
  }
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  snprintf(port_string,0x10,"%d");
  iVar1 = getaddrinfo(host,port_string,&local_68,(addrinfo **)&result);
  if (iVar1 == 0) {
    iVar1 = bsd_create_socket(result->ai_family,result->ai_socktype,result->ai_protocol);
    if (iVar1 == -1) {
      freeaddrinfo((addrinfo *)result);
    }
    else {
      if (source_host != (char *)0x0) {
        getaddrinfo(source_host,(char *)0x0,(addrinfo *)0x0,&local_80);
        bind(iVar1,local_80->ai_addr,local_80->ai_addrlen);
        freeaddrinfo(local_80);
      }
      connect(iVar1,(sockaddr *)result->ai_addr,result->ai_addrlen);
      freeaddrinfo((addrinfo *)result);
      if (iVar1 != -1) {
        s = (us_socket_t *)us_create_poll(context->loop,0,socket_ext_size + 0x30);
        us_poll_init((us_poll_t *)s,iVar1,2);
        us_poll_start((us_poll_t *)s,context->loop,4);
        s->context = context;
        us_internal_socket_context_link(context,s);
        return s;
      }
    }
  }
  return (us_socket_t *)0x0;
}

Assistant:

struct us_socket_t *us_socket_context_connect(int ssl, struct us_socket_context_t *context, const char *host, int port, const char *source_host, int options, int socket_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_t *) us_internal_ssl_socket_context_connect((struct us_internal_ssl_socket_context_t *) context, host, port, source_host, options, socket_ext_size);
    }
#endif

    LIBUS_SOCKET_DESCRIPTOR connect_socket_fd = bsd_create_connect_socket(host, port, source_host, options);
    if (connect_socket_fd == LIBUS_SOCKET_ERROR) {
        return 0;
    }

    /* Connect sockets are semi-sockets just like listen sockets */
    struct us_poll_t *p = us_create_poll(context->loop, 0, sizeof(struct us_socket_t) + socket_ext_size);
    us_poll_init(p, connect_socket_fd, POLL_TYPE_SEMI_SOCKET);
    us_poll_start(p, context->loop, LIBUS_SOCKET_WRITABLE);

    struct us_socket_t *connect_socket = (struct us_socket_t *) p;

    /* Link it into context so that timeout fires properly */
    connect_socket->context = context;
    us_internal_socket_context_link(context, connect_socket);

    return connect_socket;
}